

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportWarning
          (ParserImpl *this,int line,int col,string_view message)

{
  ErrorCollector *pEVar1;
  char cVar2;
  undefined8 uVar3;
  LogMessage *pLVar4;
  size_t sVar5;
  char *pcVar6;
  LogMessage local_48 [20];
  atomic<unsigned_int> local_34;
  
  pcVar6 = message._M_str;
  sVar5 = message._M_len;
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[3])(pEVar1,(ulong)(uint)line,(ulong)(uint)col,sVar5,pcVar6);
    return;
  }
  if (line < 0) {
    cVar2 = absl::lts_20240722::log_internal::LogEveryPow2State::ShouldLog();
    if (cVar2 == '\0') {
      return;
    }
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0x1c2);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_48,0x1c,"Warning parsing text-format ");
    uVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                      (local_48,(string *)(this->root_message_type_->all_names_ + 1));
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (uVar3,6," (N = ");
    pLVar4 = (LogMessage *)
             _ZN4absl12lts_2024072212log_internal10LogMessagelsIjTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                       (uVar3);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(pLVar4,3,"): ")
    ;
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,sVar5,pcVar6);
  }
  else {
    cVar2 = absl::lts_20240722::log_internal::LogEveryPow2State::ShouldLog();
    if (cVar2 == '\0') {
      return;
    }
    local_34.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         (__atomic_base<unsigned_int>)
         ReportWarning::absl_log_internal_stateful_condition_state.counter_.
         super___atomic_base<unsigned_int>._M_i;
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0x1bd);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_48,0x1c,"Warning parsing text-format ");
    uVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                      (local_48,(string *)(this->root_message_type_->all_names_ + 1));
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(uVar3,2,": ");
    uVar3 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                      (uVar3);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(uVar3,1,":");
    uVar3 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                      (uVar3);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (uVar3,6," (N = ");
    pLVar4 = (LogMessage *)
             _ZN4absl12lts_2024072212log_internal10LogMessagelsIjTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                       (uVar3);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(pLVar4,3,"): ")
    ;
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,sVar5,pcVar6);
  }
  absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_48);
  return;
}

Assistant:

void ReportWarning(int line, int col, const absl::string_view message) {
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << ": " << (line + 1) << ":" << (col + 1) << " (N = " << COUNTER
            << "): " << message;
      } else {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << " (N = " << COUNTER << "): " << message;
      }
    } else {
      error_collector_->RecordWarning(line, col, message);
    }
  }